

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_shrink(jit_State *J)

{
  uint uVar1;
  uint maxslot_00;
  BCReg BVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SnapEntry *pSVar5;
  BCReg BVar6;
  uint uVar7;
  SnapShot *pSVar8;
  BCReg s;
  BCReg minslot;
  BCReg baseslot;
  BCReg maxslot;
  uint8_t udf [258];
  MSize nent;
  MSize nlim;
  MSize m;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  jit_State *J_local;
  uint64_t pcbase;
  
  pSVar8 = (J->cur).snap + (int)((J->cur).nsnap - 1);
  pSVar5 = (J->cur).snapmap;
  uVar1 = pSVar8->mapofs;
  register0x00000000 = (uint)pSVar8->nent;
  maxslot_00 = J->maxslot;
  BVar2 = J->baseslot;
  BVar6 = snap_usedef(J,(uint8_t *)&baseslot,
                      (BCIns *)(*(ulong *)(pSVar5 + (ulong)uVar1 + (ulong)register0x00000000) >> 8),
                      maxslot_00);
  if (BVar6 < maxslot_00) {
    snap_useuv(J->pt,(uint8_t *)&baseslot);
  }
  pSVar8->nslots = (uint8_t)(BVar2 + maxslot_00);
  nent = 0;
  for (nlim = 0; nlim < stack0xffffffffffffffc0; nlim = nlim + 1) {
    uVar7 = pSVar5[(ulong)uVar1 + (ulong)nlim] >> 0x18;
    if ((uVar7 < BVar2 + BVar6) ||
       ((uVar7 < BVar2 + maxslot_00 && (*(char *)((long)&baseslot + (ulong)(uVar7 - BVar2)) == '\0')
        ))) {
      pSVar5[(ulong)uVar1 + (ulong)nent] = pSVar5[(ulong)uVar1 + (ulong)nlim];
      nent = nent + 1;
    }
  }
  pSVar8->nent = (uint8_t)nent;
  uVar3 = (J->cur).nsnapmap;
  uVar4 = pSVar8->mapofs;
  while (nlim <= (uVar3 - uVar4) - 1) {
    pSVar5[(ulong)uVar1 + (ulong)nent] = pSVar5[(ulong)uVar1 + (ulong)nlim];
    nent = nent + 1;
    nlim = nlim + 1;
  }
  (J->cur).nsnapmap = pSVar8->mapofs + nent;
  return;
}

Assistant:

void lj_snap_shrink(jit_State *J)
{
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  SnapEntry *map = &J->cur.snapmap[snap->mapofs];
  MSize n, m, nlim, nent = snap->nent;
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg baseslot = J->baseslot;
  BCReg minslot = snap_usedef(J, udf, snap_pc(&map[nent]), maxslot);
  if (minslot < maxslot) snap_useuv(J->pt, udf);
  maxslot += baseslot;
  minslot += baseslot;
  snap->nslots = (uint8_t)maxslot;
  for (n = m = 0; n < nent; n++) {  /* Remove unused slots from snapshot. */
    BCReg s = snap_slot(map[n]);
    if (s < minslot || (s < maxslot && udf[s-baseslot] == 0))
      map[m++] = map[n];  /* Only copy used slots. */
  }
  snap->nent = (uint8_t)m;
  nlim = J->cur.nsnapmap - snap->mapofs - 1;
  while (n <= nlim) map[m++] = map[n++];  /* Move PC + frame links down. */
  J->cur.nsnapmap = (uint32_t)(snap->mapofs + m);  /* Free up space in map. */
}